

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

_Bool oonf_layer2_net_commit(oonf_layer2_net *l2net)

{
  long lVar1;
  _Bool _Var2;
  
  if ((l2net->neighbors).count == 0) {
    lVar1 = 0x130;
    do {
      if ((*(long *)(l2net->name + lVar1) != 0) && (*(long *)(l2net->name + lVar1 + -8) != 0))
      goto LAB_0011828d;
      lVar1 = lVar1 + 0x28;
    } while (lVar1 != 0x3b0);
    lVar1 = 0x3b0;
    do {
      if ((*(long *)(l2net->name + lVar1) != 0) && (*(long *)(l2net->name + lVar1 + -8) != 0))
      goto LAB_0011828d;
      lVar1 = lVar1 + 0x28;
    } while (lVar1 != 0x7c0);
    _net_remove(l2net);
    _Var2 = true;
  }
  else {
LAB_0011828d:
    _Var2 = false;
    oonf_class_event(&_l2network_class,l2net,OONF_OBJECT_CHANGED);
  }
  return _Var2;
}

Assistant:

bool
oonf_layer2_net_commit(struct oonf_layer2_net *l2net) {
  size_t i;

  if (l2net->neighbors.count > 0) {
    oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_CHANGED);
    return false;
  }

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (oonf_layer2_data_has_value(&l2net->data[i])) {
      oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_CHANGED);
      return false;
    }
  }

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_has_value(&l2net->neighdata[i])) {
      oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_CHANGED);
      return false;
    }
  }

  _net_remove(l2net);
  return true;
}